

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

void __thiscall
OpenMD::EAMAdapter::makeZhou2005Oxygen
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType gamma,RealType nu,
          vector<double,_std::allocator<double>_> *OrhoLimits,
          vector<double,_std::allocator<double>_> *OrhoE,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *OF)

{
  AtomType *pAVar1;
  bool bVar2;
  undefined1 local_1f9;
  SimpleTypeData<OpenMD::ZhouParameters> *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1f0 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1e0;
  RealType local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  shared_ptr<OpenMD::GenericData> local_198;
  shared_ptr<OpenMD::GenericData> local_188;
  EAMParameters local_170;
  ZhouParameters local_140;
  
  local_1e0 = OF;
  local_1d8 = re;
  local_1d0 = fe;
  local_1c8 = alpha;
  local_1c0 = beta;
  local_1b8 = A;
  local_1b0 = B;
  local_1a8 = kappa;
  local_1a0 = lambda;
  bVar2 = AtomType::hasProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)OpenMD::ZhouTypeID_abi_cxx11_);
  }
  local_170.latticeType._M_dataplus._M_p = (pointer)&local_170.latticeType.field_2;
  local_170.latticeType._M_string_length = 0;
  local_170.latticeType.field_2._M_local_buf[0] = '\0';
  memset(&local_140.rhoe,0,0x100);
  local_170.eamType = eamZhou2005Oxygen;
  local_170.latticeConstant = local_1d8;
  local_140.re = local_1d8;
  local_140.fe = local_1d0;
  local_140.alpha = local_1c8;
  local_140.beta = local_1c0;
  local_140.A = local_1b8;
  local_140.B = local_1b0;
  local_140.kappa = local_1a8;
  local_140.lambda = local_1a0;
  local_140.gamma = gamma;
  local_140.nu = nu;
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.OrhoLimits,OrhoLimits);
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.OrhoE,OrhoE);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&local_140.OF,local_1e0);
  pAVar1 = this->at_;
  local_1f8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (a_Stack_1f0,(SimpleTypeData<OpenMD::EAMParameters> **)&local_1f8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)&local_1f9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::EAMtypeID_abi_cxx11_,&local_170);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1f8->super_GenericData;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1f0[0]._M_pi;
  local_1f8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  a_Stack_1f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_188);
  if (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (a_Stack_1f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1f0[0]._M_pi);
  }
  pAVar1 = this->at_;
  local_1f8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (a_Stack_1f0,&local_1f8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)&local_1f9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::ZhouTypeID_abi_cxx11_,&local_140);
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1f8->super_GenericData;
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1f0[0]._M_pi;
  local_1f8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  a_Stack_1f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_198);
  if (local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (a_Stack_1f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1f0[0]._M_pi);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_140.OF);
  if (local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.latticeType._M_dataplus._M_p != &local_170.latticeType.field_2) {
    operator_delete(local_170.latticeType._M_dataplus._M_p,
                    CONCAT71(local_170.latticeType.field_2._M_allocated_capacity._1_7_,
                             local_170.latticeType.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EAMAdapter::makeZhou2005Oxygen(RealType re, RealType fe, RealType alpha,
                                      RealType beta, RealType A, RealType B,
                                      RealType kappa, RealType lambda,
                                      RealType gamma, RealType nu,
                                      std::vector<RealType> OrhoLimits,
                                      std::vector<RealType> OrhoE,
                                      std::vector<std::vector<RealType>> OF) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2005Oxygen;

    eamParam.latticeConstant = re;

    zhouParam.re         = re;
    zhouParam.fe         = fe;
    zhouParam.alpha      = alpha;
    zhouParam.beta       = beta;
    zhouParam.A          = A;
    zhouParam.B          = B;
    zhouParam.kappa      = kappa;
    zhouParam.lambda     = lambda;
    zhouParam.gamma      = gamma;
    zhouParam.nu         = nu;
    zhouParam.OrhoLimits = OrhoLimits;
    zhouParam.OrhoE      = OrhoE;
    zhouParam.OF         = OF;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }